

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O0

void __thiscall gvr::TexturedMesh::loadPLY(TexturedMesh *this,PLYReader *ply)

{
  bool bVar1;
  bool bVar2;
  ply_type pVar3;
  long lVar4;
  size_type sVar5;
  reference pvVar6;
  char *pcVar7;
  ulong uVar8;
  string *in_RSI;
  TexturedMesh *in_RDI;
  TriangleReceiver tr;
  int tn;
  FloatArrayReceiver tv;
  FloatArrayReceiver tu;
  FloatArrayReceiver nz;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sz;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver sc;
  FloatArrayReceiver se;
  FloatArrayReceiver ss;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  FloatArrayReceiver vx;
  size_t j;
  size_t k;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  int vn;
  undefined4 in_stack_fffffffffffff038;
  uint uVar9;
  undefined4 in_stack_fffffffffffff03c;
  Mesh *in_stack_fffffffffffff040;
  PLYReader *in_stack_fffffffffffff048;
  PLYReader *in_stack_fffffffffffff050;
  undefined4 in_stack_fffffffffffff058;
  undefined4 in_stack_fffffffffffff05c;
  PLYReader *in_stack_fffffffffffff060;
  allocator *paVar10;
  bool local_f85;
  Mesh *this_00;
  PLYReader *in_stack_fffffffffffff278;
  Model *in_stack_fffffffffffff280;
  bool local_ca5;
  bool local_c3d;
  undefined1 local_bc1 [38];
  byte local_b9b;
  byte local_b9a;
  undefined1 local_b99 [38];
  byte local_b73;
  byte local_b72;
  allocator local_b71;
  string local_b70 [37];
  byte local_b4b;
  byte local_b4a;
  allocator local_b49;
  string local_b48 [39];
  allocator local_b21;
  string local_b20 [39];
  undefined1 local_af9 [40];
  allocator local_ad1;
  string local_ad0 [39];
  allocator local_aa9;
  string local_aa8 [39];
  allocator local_a81;
  string local_a80 [39];
  allocator local_a59;
  string local_a58 [55];
  allocator local_a21;
  string local_a20 [39];
  allocator local_9f9;
  string local_9f8 [39];
  allocator local_9d1;
  string local_9d0 [39];
  allocator local_9a9;
  string local_9a8 [39];
  allocator local_981;
  string local_980 [39];
  allocator local_959;
  string local_958 [39];
  allocator local_931;
  string local_930 [39];
  allocator local_909;
  string local_908 [39];
  allocator local_8e1;
  string local_8e0 [39];
  allocator local_8b9;
  string local_8b8 [39];
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [39];
  allocator local_841;
  string local_840 [103];
  allocator local_7d9;
  string local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [39];
  allocator local_789;
  string local_788 [39];
  allocator local_761;
  string local_760 [39];
  allocator local_739;
  string local_738 [39];
  allocator local_711;
  string local_710 [135];
  allocator local_689;
  string local_688 [39];
  allocator local_661;
  string local_660 [39];
  allocator local_639;
  string local_638 [39];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [135];
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [135];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [133];
  byte local_29b;
  byte local_29a;
  allocator local_299;
  string local_298 [37];
  byte local_273;
  byte local_272;
  allocator local_271;
  string local_270 [37];
  byte local_24b;
  byte local_24a;
  allocator local_249;
  string local_248 [37];
  byte local_223;
  byte local_222;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [37];
  byte local_1ab;
  byte local_1aa;
  allocator local_1a9;
  string local_1a8 [37];
  byte local_183;
  byte local_182;
  allocator local_181;
  string local_180 [37];
  byte local_15b;
  byte local_15a;
  allocator local_159;
  string local_158 [37];
  byte local_133;
  byte local_132;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [32];
  long local_a0;
  string local_98 [32];
  long local_78;
  ulong local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  allocator local_39;
  string local_38 [36];
  uint local_14;
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"vertex",&local_39);
  lVar4 = PLYReader::instancesOfElement
                    (in_stack_fffffffffffff048,(string *)in_stack_fffffffffffff040);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_14 = (uint)lVar4;
  Model::setOriginFromPLY(in_stack_fffffffffffff280,in_stack_fffffffffffff278);
  std::__cxx11::string::operator=((string *)&in_RDI->basepath,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14f1e5);
  PLYReader::getComments
            (in_stack_fffffffffffff060,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
  local_70 = 0;
  do {
    uVar8 = local_70;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_68);
    if (sVar5 <= uVar8) {
LAB_0014f494:
      uVar9 = local_14;
      std::allocator<char>::allocator();
      local_132 = 0;
      local_133 = 0;
      local_15a = 0;
      local_15b = 0;
      local_182 = 0;
      local_183 = 0;
      local_1aa = 0;
      local_1ab = 0;
      std::__cxx11::string::string(local_e0,"vertex",&local_e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"scan_size",&local_109);
      pVar3 = PLYReader::getTypeOfProperty
                        ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                         &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename);
      local_c3d = true;
      if (pVar3 == ply_none) {
        std::allocator<char>::allocator();
        local_132 = 1;
        std::__cxx11::string::string(local_130,"vertex",&local_131);
        local_133 = 1;
        std::allocator<char>::allocator();
        local_15a = 1;
        std::__cxx11::string::string(local_158,"scan_error",&local_159);
        local_15b = 1;
        pVar3 = PLYReader::getTypeOfProperty
                          ((PLYReader *)
                           CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                           &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename
                          );
        local_c3d = true;
        if (pVar3 == ply_none) {
          std::allocator<char>::allocator();
          local_182 = 1;
          std::__cxx11::string::string(local_180,"vertex",&local_181);
          local_183 = 1;
          std::allocator<char>::allocator();
          local_1aa = 1;
          std::__cxx11::string::string(local_1a8,"scan_conf",&local_1a9);
          local_1ab = 1;
          pVar3 = PLYReader::getTypeOfProperty
                            ((PLYReader *)
                             CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                             &in_stack_fffffffffffff050->filename,
                             &in_stack_fffffffffffff048->filename);
          local_c3d = pVar3 != ply_none;
        }
      }
      std::allocator<char>::allocator();
      local_222 = 0;
      local_223 = 0;
      local_24a = 0;
      local_24b = 0;
      local_272 = 0;
      local_273 = 0;
      local_29a = 0;
      local_29b = 0;
      std::__cxx11::string::string(local_1d0,"vertex",&local_1d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"sx",&local_1f9);
      pVar3 = PLYReader::getTypeOfProperty
                        ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                         &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename);
      local_ca5 = false;
      if (pVar3 != ply_none) {
        std::allocator<char>::allocator();
        local_222 = 1;
        std::__cxx11::string::string(local_220,"vertex",&local_221);
        local_223 = 1;
        std::allocator<char>::allocator();
        local_24a = 1;
        std::__cxx11::string::string(local_248,"sy",&local_249);
        local_24b = 1;
        pVar3 = PLYReader::getTypeOfProperty
                          ((PLYReader *)
                           CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                           &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename
                          );
        local_ca5 = false;
        if (pVar3 != ply_none) {
          std::allocator<char>::allocator();
          local_272 = 1;
          std::__cxx11::string::string(local_270,"vertex",&local_271);
          local_273 = 1;
          std::allocator<char>::allocator();
          local_29a = 1;
          std::__cxx11::string::string(local_298,"sz",&local_299);
          local_29b = 1;
          pVar3 = PLYReader::getTypeOfProperty
                            ((PLYReader *)
                             CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                             &in_stack_fffffffffffff050->filename,
                             &in_stack_fffffffffffff048->filename);
          local_ca5 = pVar3 != ply_none;
        }
      }
      (*(in_RDI->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])
                (in_RDI,(ulong)uVar9,(ulong)local_c3d,(ulong)local_ca5);
      if ((local_29b & 1) != 0) {
        std::__cxx11::string::~string(local_298);
      }
      if ((local_29a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_299);
      }
      if ((local_273 & 1) != 0) {
        std::__cxx11::string::~string(local_270);
      }
      if ((local_272 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_271);
      }
      if ((local_24b & 1) != 0) {
        std::__cxx11::string::~string(local_248);
      }
      if ((local_24a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
      }
      if ((local_223 & 1) != 0) {
        std::__cxx11::string::~string(local_220);
      }
      if ((local_222 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
      }
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      if ((local_1ab & 1) != 0) {
        std::__cxx11::string::~string(local_1a8);
      }
      if ((local_1aa & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      }
      if ((local_183 & 1) != 0) {
        std::__cxx11::string::~string(local_180);
      }
      if ((local_182 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
      }
      if ((local_15b & 1) != 0) {
        std::__cxx11::string::~string(local_158);
      }
      if ((local_15a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
      }
      if ((local_133 & 1) != 0) {
        std::__cxx11::string::~string(local_130);
      }
      if ((local_132 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
      }
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      PointCloud::getVertexArray((PointCloud *)in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      PointCloud::getVertexArray((PointCloud *)in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      PointCloud::getVertexArray((PointCloud *)in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,"vertex",&local_321);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_348,"x",&local_349);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_348);
      std::allocator<char>::~allocator((allocator<char> *)&local_349);
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_370,"vertex",&local_371);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_398,"y",&local_399);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_398);
      std::allocator<char>::~allocator((allocator<char> *)&local_399);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3c0,"vertex",&local_3c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e8,"z",&local_3e9);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      PointCloud::getScanPropArray((PointCloud *)in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      PointCloud::getScanPropArray((PointCloud *)in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      PointCloud::getScanPropArray((PointCloud *)in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      bVar2 = PointCloud::hasScanProp((PointCloud *)in_RDI);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_470,"vertex",&local_471);
        paVar10 = &local_499;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_498,"scan_size",paVar10);
        PLYReader::setReceiver
                  ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                   &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                   (PLYReceiver *)in_stack_fffffffffffff040);
        std::__cxx11::string::~string(local_498);
        std::allocator<char>::~allocator((allocator<char> *)&local_499);
        std::__cxx11::string::~string(local_470);
        std::allocator<char>::~allocator((allocator<char> *)&local_471);
        paVar10 = &local_4c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4c0,"vertex",paVar10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4e8,"scan_error",&local_4e9);
        PLYReader::setReceiver
                  ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                   &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                   (PLYReceiver *)in_stack_fffffffffffff040);
        std::__cxx11::string::~string(local_4e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
        std::__cxx11::string::~string(local_4c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_510,"vertex",&local_511);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_538,"scan_conf",&local_539);
        PLYReader::setReceiver
                  ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                   &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                   (PLYReceiver *)in_stack_fffffffffffff040);
        std::__cxx11::string::~string(local_538);
        std::allocator<char>::~allocator((allocator<char> *)&local_539);
        std::__cxx11::string::~string(local_510);
        std::allocator<char>::~allocator((allocator<char> *)&local_511);
      }
      PointCloud::getScanPosArray((PointCloud *)in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      PointCloud::getScanPosArray((PointCloud *)in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      PointCloud::getScanPosArray((PointCloud *)in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      bVar2 = PointCloud::hasScanPos((PointCloud *)in_RDI);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5c0,"vertex",&local_5c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5e8,"sx",&local_5e9);
        PLYReader::setReceiver
                  ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                   &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                   (PLYReceiver *)in_stack_fffffffffffff040);
        std::__cxx11::string::~string(local_5e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
        std::__cxx11::string::~string(local_5c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_610,"vertex",&local_611);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_638,"sy",&local_639);
        PLYReader::setReceiver
                  ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                   &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                   (PLYReceiver *)in_stack_fffffffffffff040);
        std::__cxx11::string::~string(local_638);
        std::allocator<char>::~allocator((allocator<char> *)&local_639);
        std::__cxx11::string::~string(local_610);
        std::allocator<char>::~allocator((allocator<char> *)&local_611);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_660,"vertex",&local_661);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_688,"sz",&local_689);
        PLYReader::setReceiver
                  ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                   &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                   (PLYReceiver *)in_stack_fffffffffffff040);
        std::__cxx11::string::~string(local_688);
        std::allocator<char>::~allocator((allocator<char> *)&local_689);
        std::__cxx11::string::~string(local_660);
        std::allocator<char>::~allocator((allocator<char> *)&local_661);
      }
      Mesh::getNormalArray(&in_RDI->super_Mesh);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      Mesh::getNormalArray(&in_RDI->super_Mesh);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      Mesh::getNormalArray(&in_RDI->super_Mesh);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_710,"vertex",&local_711);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_738,"nx",&local_739);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_738);
      std::allocator<char>::~allocator((allocator<char> *)&local_739);
      std::__cxx11::string::~string(local_710);
      std::allocator<char>::~allocator((allocator<char> *)&local_711);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_760,"vertex",&local_761);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,"ny",&local_789);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_788);
      std::allocator<char>::~allocator((allocator<char> *)&local_789);
      std::__cxx11::string::~string(local_760);
      std::allocator<char>::~allocator((allocator<char> *)&local_761);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7b0,"vertex",&local_7b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7d8,"nz",&local_7d9);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_7d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
      std::__cxx11::string::~string(local_7b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
      getTextureCoordArray(in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      getTextureCoordArray(in_RDI);
      FloatArrayReceiver::FloatArrayReceiver
                ((FloatArrayReceiver *)in_stack_fffffffffffff050,(float *)in_stack_fffffffffffff048,
                 (size_t)in_stack_fffffffffffff040,
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_840,"vertex",&local_841);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_868,"u",&local_869);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_868);
      std::allocator<char>::~allocator((allocator<char> *)&local_869);
      std::__cxx11::string::~string(local_840);
      std::allocator<char>::~allocator((allocator<char> *)&local_841);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_890,"vertex",&local_891);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8b8,"v",&local_8b9);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_8b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
      std::__cxx11::string::~string(local_890);
      std::allocator<char>::~allocator((allocator<char> *)&local_891);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8e0,"vertex",&local_8e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_908,"texture_u",&local_909);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_908);
      std::allocator<char>::~allocator((allocator<char> *)&local_909);
      std::__cxx11::string::~string(local_8e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_930,"vertex",&local_931);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_958,"texture_v",&local_959);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_958);
      std::allocator<char>::~allocator((allocator<char> *)&local_959);
      std::__cxx11::string::~string(local_930);
      std::allocator<char>::~allocator((allocator<char> *)&local_931);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_980,"vertex",&local_981);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9a8,"s",&local_9a9);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_9a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
      std::__cxx11::string::~string(local_980);
      std::allocator<char>::~allocator((allocator<char> *)&local_981);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9d0,"vertex",&local_9d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9f8,"t",&local_9f9);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_9f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
      std::__cxx11::string::~string(local_9d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a20,"face",&local_a21);
      uVar8 = PLYReader::instancesOfElement
                        (in_stack_fffffffffffff048,(string *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_a20);
      std::allocator<char>::~allocator((allocator<char> *)&local_a21);
      local_a20._32_4_ = (int)uVar8;
      (*(in_RDI->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])
                (in_RDI,uVar8 & 0xffffffff);
      TriangleReceiver::TriangleReceiver
                ((TriangleReceiver *)in_stack_fffffffffffff040,
                 (Mesh *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a58,"face",&local_a59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a80,"vertex_index",&local_a81);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_a80);
      std::allocator<char>::~allocator((allocator<char> *)&local_a81);
      std::__cxx11::string::~string(local_a58);
      std::allocator<char>::~allocator((allocator<char> *)&local_a59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa8,"face",&local_aa9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ad0,"vertex_indices",&local_ad1);
      PLYReader::setReceiver
                ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                 &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename,
                 (PLYReceiver *)in_stack_fffffffffffff040);
      std::__cxx11::string::~string(local_ad0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
      std::__cxx11::string::~string(local_aa8);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa9);
      PLYReader::readData(in_stack_fffffffffffff050);
      this_00 = (Mesh *)local_af9;
      std::allocator<char>::allocator();
      local_b4a = 0;
      local_b4b = 0;
      local_b72 = 0;
      local_b73 = 0;
      local_b9a = 0;
      local_b9b = 0;
      bVar1 = false;
      bVar2 = false;
      std::__cxx11::string::string((string *)(local_af9 + 1),"vertex",(allocator *)this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b20,"nx",&local_b21);
      pVar3 = PLYReader::getTypeOfProperty
                        ((PLYReader *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                         &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename);
      local_f85 = true;
      if (pVar3 != ply_none) {
        std::allocator<char>::allocator();
        local_b4a = 1;
        std::__cxx11::string::string(local_b48,"vertex",&local_b49);
        local_b4b = 1;
        paVar10 = &local_b71;
        std::allocator<char>::allocator();
        local_b72 = 1;
        std::__cxx11::string::string(local_b70,"ny",paVar10);
        local_b73 = 1;
        pVar3 = PLYReader::getTypeOfProperty
                          ((PLYReader *)
                           CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                           &in_stack_fffffffffffff050->filename,&in_stack_fffffffffffff048->filename
                          );
        local_f85 = true;
        if (pVar3 != ply_none) {
          in_stack_fffffffffffff050 = (PLYReader *)local_b99;
          std::allocator<char>::allocator();
          local_b9a = 1;
          std::__cxx11::string::string
                    ((string *)(local_b99 + 1),"vertex",(allocator *)in_stack_fffffffffffff050);
          local_b9b = 1;
          in_stack_fffffffffffff040 = (Mesh *)local_bc1;
          std::allocator<char>::allocator();
          bVar1 = true;
          std::__cxx11::string::string
                    ((string *)(local_bc1 + 1),"nz",(allocator *)in_stack_fffffffffffff040);
          bVar2 = true;
          pVar3 = PLYReader::getTypeOfProperty
                            ((PLYReader *)CONCAT44(pVar3,in_stack_fffffffffffff058),
                             &in_stack_fffffffffffff050->filename,local_10);
          local_f85 = pVar3 == ply_none;
        }
      }
      uVar9 = (uint)local_f85 << 0x18;
      if (bVar2) {
        std::__cxx11::string::~string((string *)(local_bc1 + 1));
      }
      if (bVar1) {
        std::allocator<char>::~allocator((allocator<char> *)local_bc1);
      }
      if ((local_b9b & 1) != 0) {
        std::__cxx11::string::~string((string *)(local_b99 + 1));
      }
      if ((local_b9a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)local_b99);
      }
      if ((local_b73 & 1) != 0) {
        std::__cxx11::string::~string(local_b70);
      }
      if ((local_b72 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_b71);
      }
      if ((local_b4b & 1) != 0) {
        std::__cxx11::string::~string(local_b48);
      }
      if ((local_b4a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_b49);
      }
      std::__cxx11::string::~string(local_b20);
      std::allocator<char>::~allocator((allocator<char> *)&local_b21);
      std::__cxx11::string::~string((string *)(local_af9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_af9);
      if ((uVar9 & 0x1000000) == 0) {
        Mesh::normalizeNormals(in_stack_fffffffffffff040);
      }
      else {
        Mesh::recalculateNormals(this_00);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff050);
      return;
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_68,local_70);
    local_78 = std::__cxx11::string::find((char *)pvVar6,0x15ca28);
    if (local_78 != 0) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_68,local_70);
      local_78 = std::__cxx11::string::find((char *)pvVar6,0x15ca34);
    }
    if (local_78 == 0) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_68,local_70);
      std::__cxx11::string::substr((ulong)local_98,(ulong)pvVar6);
      std::__cxx11::string::operator=((string *)&in_RDI->name,local_98);
      std::__cxx11::string::~string(local_98);
      gutil::trim((string *)&in_RDI->name);
      pcVar7 = PLYReader::getName((PLYReader *)0x14f3a3);
      std::__cxx11::string::operator=((string *)&in_RDI->basepath,pcVar7);
      local_a0 = std::__cxx11::string::find_last_of((char *)&in_RDI->basepath,0x15ca40);
      if (local_a0 == -1) {
        std::__cxx11::string::operator=((string *)&in_RDI->basepath,"");
      }
      else {
        std::__cxx11::string::substr((ulong)local_c0,(ulong)&in_RDI->basepath);
        std::__cxx11::string::operator=((string *)&in_RDI->basepath,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      goto LAB_0014f494;
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

void TexturedMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // get texture name

  basepath="";

  std::vector<std::string> comment;
  ply.getComments(comment);

  for (size_t i=0; i<comment.size(); i++)
  {
    size_t k=comment[i].find("TextureFile");

    if (k != 0)
    {
      k=comment[i].find("texturefile");
    }

    if (k == 0)
    {
      name=comment[i].substr(11);
      gutil::trim(name);

      basepath=ply.getName();

      size_t j=basepath.find_last_of("/\\");

      if (j != basepath.npos)
      {
        basepath=basepath.substr(0, j+1);
      }
      else
      {
        basepath="";
      }

      break;
    }
  }

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  FloatArrayReceiver tu(getTextureCoordArray(), 2, 0), tv(getTextureCoordArray(), 2, 1);

  ply.setReceiver("vertex", "u", &tu);
  ply.setReceiver("vertex", "v", &tv);
  ply.setReceiver("vertex", "texture_u", &tu);
  ply.setReceiver("vertex", "texture_v", &tv);
  ply.setReceiver("vertex", "s", &tu);
  ply.setReceiver("vertex", "t", &tv);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}